

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_int8.h
# Opt level: O1

void ncnn::conv_im2col_sgemm_int8_requant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,int kernel_w,int kernel_h,int stride_w,
               int stride_h,Mat *_bias,vector<float,_std::allocator<float>_> *scale_requant,
               Option *opt)

{
  int *piVar1;
  size_t sVar2;
  size_t sVar3;
  pointer pfVar4;
  float fVar5;
  int iVar6;
  uint uVar7;
  float fVar8;
  ulong uVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *pvVar10;
  undefined4 extraout_var_01;
  undefined1 *puVar11;
  char *pcVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  float fVar16;
  undefined1 *puVar17;
  char *pcVar18;
  long lVar19;
  void *pvVar20;
  long lVar21;
  int n_1;
  void *pvVar22;
  undefined4 *puVar23;
  int iVar24;
  void *pvVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  void *pvVar29;
  uint uVar30;
  int iVar31;
  long lVar32;
  long lVar33;
  undefined1 *puVar34;
  void *pvVar35;
  long lVar36;
  void *pvVar37;
  char *pcVar38;
  int p;
  ulong uVar39;
  ulong uVar40;
  undefined1 *puVar41;
  char *ret;
  void *__ptr;
  void *pvVar42;
  undefined4 uVar43;
  undefined4 extraout_XMM0_Db;
  undefined1 auVar44 [12];
  undefined4 extraout_XMM0_Db_00;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined4 uVar47;
  undefined4 uVar48;
  int sum3 [4];
  int sum2 [4];
  int sum1 [4];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  int *local_1c0;
  float local_1b4;
  void *local_1b0;
  ulong local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  float fStack_190;
  float fStack_18c;
  long local_180;
  undefined8 local_178;
  undefined4 uStack_16c;
  ulong local_168;
  ulong local_160;
  undefined8 local_158;
  float fStack_150;
  float fStack_14c;
  undefined8 local_148;
  uint local_12c;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  int *local_f8;
  char *local_f0;
  undefined8 local_e8;
  float fStack_e0;
  float fStack_dc;
  undefined8 local_d8;
  float fStack_d0;
  float fStack_cc;
  Allocator *local_c8;
  Allocator *local_c0;
  ulong local_b8;
  void *local_b0;
  ulong local_a8;
  undefined1 *local_a0;
  int local_98 [12];
  int *local_68;
  Mat *local_60;
  ulong local_58;
  char *local_50;
  undefined1 *local_48;
  Allocator *local_40;
  undefined1 *local_38;
  
  uVar9 = (ulong)(uint)stride_w;
  local_198 = (ulong)(uint)bottom_blob->c;
  local_d8 = _kernel->data;
  local_b0 = _bias->data;
  local_1a0 = (ulong)(uint)(kernel_h * kernel_w);
  uVar13 = bottom_blob->c * kernel_h * kernel_w;
  local_158 = CONCAT44(local_158._4_4_,top_blob->h);
  local_148 = (void *)CONCAT44(local_148._4_4_,top_blob->w);
  fVar5 = (float)(top_blob->h * top_blob->w);
  uVar30 = bottom_blob->w;
  local_168 = (ulong)top_blob->c;
  local_c0 = opt->workspace_allocator;
  local_60 = top_blob;
  if ((int)fVar5 * uVar13 == 0) {
    local_1c0 = (int *)0x0;
    __ptr = (void *)0x0;
  }
  else {
    local_178 = CONCAT44(local_178._4_4_,stride_w);
    uVar9 = (long)(int)((int)fVar5 * uVar13) + 3U & 0xfffffffffffffffc;
    if (local_c0 == (Allocator *)0x0) {
      local_1d8 = (void *)0x0;
      iVar6 = posix_memalign((void **)&local_1d8,0x10,uVar9 + 4);
      __ptr = local_1d8;
      if (iVar6 != 0) {
        local_1d8 = (void *)0x0;
        __ptr = local_1d8;
      }
    }
    else {
      iVar6 = (*local_c0->_vptr_Allocator[2])();
      __ptr = (void *)CONCAT44(extraout_var,iVar6);
    }
    local_1c0 = (int *)((long)__ptr + uVar9);
    *(undefined4 *)((long)__ptr + uVar9) = 1;
    uVar9 = local_178 & 0xffffffff;
  }
  if (0 < (int)(float)local_158) {
    local_e8 = (ulong)(stride_h * uVar30);
    local_108._0_8_ = uVar9;
    lVar33 = 0;
    iVar26 = 0;
    iVar6 = 0;
    do {
      local_128._0_4_ = iVar6;
      local_118._0_8_ = lVar33;
      if (0 < (int)(float)local_148) {
        iVar14 = 0;
        lVar32 = lVar33;
        do {
          local_178 = CONCAT44(local_178._4_4_,iVar14);
          if (0 < (int)(float)local_198) {
            uVar39 = 0;
            do {
              if (0 < kernel_h) {
                sVar2 = bottom_blob->cstep;
                sVar3 = bottom_blob->elemsize;
                pvVar42 = bottom_blob->data;
                iVar24 = 0;
                lVar36 = lVar32;
                do {
                  if (0 < kernel_w) {
                    uVar40 = 0;
                    do {
                      *(undefined1 *)((long)__ptr + uVar40 + (long)iVar26) =
                           *(undefined1 *)
                            ((long)pvVar42 +
                            (long)((int)lVar36 + (int)uVar40) + sVar2 * uVar39 * sVar3);
                      uVar40 = uVar40 + 1;
                    } while ((uint)kernel_w != uVar40);
                    iVar26 = iVar26 + (int)uVar40;
                  }
                  iVar24 = iVar24 + 1;
                  lVar36 = lVar36 + (ulong)uVar30;
                } while (iVar24 != kernel_h);
              }
              uVar39 = uVar39 + 1;
            } while (uVar39 != local_198);
          }
          iVar14 = iVar14 + 1;
          lVar32 = lVar32 + uVar9;
        } while ((float)iVar14 != (float)local_148);
      }
      iVar6 = iVar6 + 1;
      lVar33 = lVar33 + local_e8;
    } while ((float)iVar6 != (float)local_158);
  }
  iVar6 = (int)local_1a0 * 4;
  fVar16 = (float)((int)fVar5 + 3);
  if (-1 < (int)fVar5) {
    fVar16 = fVar5;
  }
  local_c8 = opt->workspace_allocator;
  local_108._0_4_ = (int)(float)local_198 * iVar6;
  local_1a8 = (long)(int)local_108._0_4_ + 0xfU & 0xfffffffffffffff0;
  uVar9 = (long)((int)fVar5 + ((int)fVar16 >> 2) * -3) * local_1a8;
  local_180 = CONCAT44(local_180._4_4_,iVar6);
  if (uVar9 == 0) {
    local_f8 = (int *)0x0;
    pvVar42 = (void *)0x0;
  }
  else {
    if (local_c8 == (Allocator *)0x0) {
      local_1d8 = (void *)0x0;
      iVar6 = posix_memalign((void **)&local_1d8,0x10,uVar9 | 4);
      pvVar42 = local_1d8;
      if (iVar6 != 0) {
        local_1d8 = (void *)0x0;
        pvVar42 = local_1d8;
      }
    }
    else {
      iVar6 = (*local_c8->_vptr_Allocator[2])();
      pvVar42 = (void *)CONCAT44(extraout_var_00,iVar6);
    }
    local_f8 = (int *)((long)pvVar42 + uVar9);
    *(undefined4 *)((long)pvVar42 + uVar9) = 1;
  }
  local_1b4 = (float)((uint)fVar5 & 0xfffffffc);
  local_158 = (long)(int)uVar13;
  if (0 < (int)fVar5 >> 2) {
    local_e8 = CONCAT44(local_e8._4_4_,uVar13) & 0xfffffffffffffffe;
    uVar39 = CONCAT44(0,(int)fVar5 >> 2);
    local_118._0_8_ = uVar39;
    lVar32 = local_158 * 4;
    local_128._0_8_ = lVar32;
    lVar33 = (long)__ptr + local_158;
    pvVar35 = (void *)((long)__ptr + local_158 * 2);
    pvVar37 = (void *)(local_158 * 3 + (long)__ptr);
    uVar9 = 0;
    pvVar22 = __ptr;
    pvVar25 = pvVar42;
    do {
      local_148 = pvVar25;
      local_178 = uVar9;
      puVar17 = (undefined1 *)(local_1a8 * local_178 + (long)pvVar42);
      if ((int)uVar13 < 2) {
        pvVar25 = (void *)(local_178 * 4 * local_158 + (long)__ptr);
        pvVar10 = (void *)((local_178 * 4 + 1) * local_158 + (long)__ptr);
        pvVar29 = (void *)((local_178 * 4 + 2) * local_158 + (long)__ptr);
        pvVar20 = (void *)((local_178 * 4 + 3) * local_158 + (long)__ptr);
        iVar6 = 0;
      }
      else {
        lVar36 = 0;
        do {
          puVar34 = puVar17;
          puVar17 = (undefined1 *)((long)local_148 + lVar36 * 4);
          *puVar17 = *(undefined1 *)((long)pvVar22 + lVar36);
          puVar17[1] = *(undefined1 *)((long)pvVar22 + lVar36 + 1);
          puVar17[2] = *(undefined1 *)(lVar33 + lVar36);
          puVar17[3] = *(undefined1 *)(lVar33 + 1 + lVar36);
          puVar17[4] = *(undefined1 *)((long)pvVar35 + lVar36);
          puVar17[5] = *(undefined1 *)((long)pvVar35 + lVar36 + 1);
          puVar17[6] = *(undefined1 *)((long)pvVar37 + lVar36);
          puVar17[7] = *(undefined1 *)((long)pvVar37 + lVar36 + 1);
          lVar19 = lVar36 + 2;
          iVar6 = (int)lVar36;
          puVar17 = puVar17 + 8;
          lVar36 = lVar19;
        } while (iVar6 + 3 < (int)uVar13);
        puVar17 = puVar34 + 8;
        pvVar25 = (void *)((long)pvVar22 + lVar19);
        pvVar10 = (void *)(lVar33 + lVar19);
        pvVar29 = (void *)((long)pvVar35 + lVar19);
        pvVar20 = (void *)(lVar19 + (long)pvVar37);
        iVar6 = (int)(float)local_e8;
      }
      if (iVar6 < (int)uVar13) {
        lVar36 = 0;
        do {
          puVar17[lVar36 * 4] = *(undefined1 *)((long)pvVar25 + lVar36);
          puVar17[lVar36 * 4 + 1] = *(undefined1 *)((long)pvVar10 + lVar36);
          puVar17[lVar36 * 4 + 2] = *(undefined1 *)((long)pvVar29 + lVar36);
          puVar17[lVar36 * 4 + 3] = *(undefined1 *)((long)pvVar20 + lVar36);
          lVar36 = lVar36 + 1;
        } while (uVar13 - iVar6 != (int)lVar36);
      }
      pvVar22 = (void *)((long)pvVar22 + lVar32);
      lVar33 = lVar33 + lVar32;
      pvVar35 = (void *)((long)pvVar35 + lVar32);
      pvVar37 = (void *)((long)pvVar37 + lVar32);
      uVar9 = local_178 + 1;
      pvVar25 = (void *)((long)local_148 + local_1a8);
    } while (local_178 + 1 != uVar39);
  }
  if (local_1b4 != fVar5) {
    lVar33 = (long)(int)local_1b4;
    do {
      puVar17 = (undefined1 *)(lVar33 * local_158 + (long)__ptr);
      uVar30 = (uint)lVar33;
      uVar7 = uVar30 + 3;
      if (-1 < (int)uVar30) {
        uVar7 = uVar30;
      }
      puVar34 = (undefined1 *)
                ((long)(int)(((int)uVar7 >> 2) + (uVar30 - (uVar7 & 0xfffffffc))) * local_1a8 +
                (long)pvVar42);
      if ((int)uVar13 < 2) {
        uVar30 = 0;
      }
      else {
        iVar6 = 1;
        do {
          *puVar34 = *puVar17;
          puVar34[1] = puVar17[1];
          puVar34 = puVar34 + 2;
          puVar17 = puVar17 + 2;
          iVar6 = iVar6 + 2;
          uVar30 = uVar13 & 0xfffffffe;
        } while (iVar6 < (int)uVar13);
      }
      if ((int)uVar30 < (int)uVar13) {
        lVar32 = 0;
        do {
          puVar34[lVar32] = puVar17[lVar32];
          lVar32 = lVar32 + 1;
        } while (uVar13 - uVar30 != (int)lVar32);
      }
      lVar33 = lVar33 + 1;
    } while (lVar33 < (int)fVar5);
  }
  uVar30 = (uint)local_168;
  uVar7 = uVar30 + 3;
  if (-1 < (int)uVar30) {
    uVar7 = uVar30;
  }
  uVar15 = uVar30 + 3;
  if (-1 < (int)uVar30) {
    uVar15 = uVar30;
  }
  local_40 = opt->workspace_allocator;
  local_160 = (long)((int)(float)local_180 * (int)(float)local_198) + 0xfU & 0xfffffffffffffff0;
  uVar9 = (long)(int)((uVar30 - (uVar15 & 0xfffffffc)) + ((int)uVar7 >> 2)) * local_160;
  if (uVar9 == 0) {
    local_1b0 = (void *)0x0;
    local_68 = (int *)0x0;
  }
  else {
    if (local_40 == (Allocator *)0x0) {
      local_1d8 = (void *)0x0;
      iVar6 = posix_memalign((void **)&local_1d8,0x10,uVar9 | 4);
      local_1b0 = local_1d8;
      if (iVar6 != 0) {
        local_1d8 = (void *)0x0;
        local_1b0 = local_1d8;
      }
    }
    else {
      iVar6 = (*local_40->_vptr_Allocator[2])();
      local_1b0 = (void *)CONCAT44(extraout_var_01,iVar6);
    }
    local_68 = (int *)(uVar9 + (long)local_1b0);
    *(undefined4 *)((long)local_1b0 + uVar9) = 1;
  }
  fVar16 = (float)((int)local_168 >> 2);
  local_b8 = local_168 & 0xfffffffffffffffc;
  local_58 = (ulong)(uint)fVar16;
  iVar6 = (int)local_198;
  if (0 < (int)fVar16) {
    iVar24 = iVar6 * (int)(float)local_1a0;
    local_148 = (void *)CONCAT44(local_148._4_4_,iVar24);
    local_118._0_4_ = uVar13 & 0xfffffffe;
    iVar14 = kernel_h * iVar6 * kernel_w;
    iVar26 = iVar14 * 3;
    iVar14 = iVar14 * 2;
    iVar27 = 0;
    uVar9 = 0;
    pvVar35 = local_1b0;
    uVar30 = uVar13;
    do {
      puVar17 = (undefined1 *)(local_160 * uVar9 + (long)local_1b0);
      local_178 = CONCAT44(local_178._4_4_,iVar26);
      if ((int)uVar13 < 2) {
        iVar28 = (int)uVar9;
        lVar33 = (long)((iVar28 * 4 + 3) * iVar24);
        lVar32 = (long)((iVar28 * 4 + 2) * iVar24);
        lVar36 = (long)((iVar28 * 4 + 1) * iVar24);
        lVar19 = (long)(iVar28 * 4 * iVar24);
        uVar7 = 0;
      }
      else {
        lVar33 = 0;
        do {
          puVar34 = puVar17;
          puVar17 = (undefined1 *)((long)pvVar35 + lVar33 * 4);
          *puVar17 = *(undefined1 *)((long)local_d8 + lVar33 + iVar27);
          puVar17[1] = *(undefined1 *)((long)local_d8 + lVar33 + (long)iVar27 + 1);
          puVar17[2] = *(undefined1 *)((long)local_d8 + lVar33 + (int)uVar30);
          puVar17[3] = *(undefined1 *)((long)local_d8 + lVar33 + (long)(int)uVar30 + 1);
          puVar17[4] = *(undefined1 *)((long)local_d8 + lVar33 + iVar14);
          puVar17[5] = *(undefined1 *)((long)local_d8 + lVar33 + (long)iVar14 + 1);
          puVar17[6] = *(undefined1 *)((long)local_d8 + lVar33 + iVar26);
          puVar17[7] = *(undefined1 *)((long)local_d8 + lVar33 + (long)iVar26 + 1);
          lVar19 = lVar33 + 2;
          iVar28 = (int)lVar33;
          lVar33 = lVar19;
          puVar17 = puVar17 + 8;
        } while (iVar28 + 3 < (int)uVar13);
        puVar17 = puVar34 + 8;
        lVar33 = lVar19 + iVar26;
        lVar32 = lVar19 + iVar14;
        lVar36 = lVar19 + (int)uVar30;
        lVar19 = lVar19 + iVar27;
        uVar7 = uVar13 & 0xfffffffe;
      }
      if ((int)uVar7 < (int)uVar13) {
        lVar21 = 0;
        do {
          puVar17[lVar21 * 4] = *(undefined1 *)((long)local_d8 + lVar21 + lVar19);
          puVar17[lVar21 * 4 + 1] = *(undefined1 *)((long)local_d8 + lVar21 + lVar36);
          puVar17[lVar21 * 4 + 2] = *(undefined1 *)((long)local_d8 + lVar21 + lVar32);
          puVar17[lVar21 * 4 + 3] = *(undefined1 *)((long)local_d8 + lVar21 + lVar33);
          lVar21 = lVar21 + 1;
        } while (uVar13 - uVar7 != (int)lVar21);
      }
      uVar9 = uVar9 + 1;
      pvVar35 = (void *)((long)pvVar35 + local_1a8);
      iVar26 = iVar26 + local_108._0_4_;
      iVar14 = iVar14 + local_108._0_4_;
      uVar30 = uVar30 + local_108._0_4_;
      iVar27 = iVar27 + local_108._0_4_;
    } while (uVar9 != local_58);
  }
  if ((int)local_b8 != (int)local_168) {
    local_198 = (ulong)(uint)(iVar6 * (int)(float)local_1a0);
    uVar9 = local_b8;
    do {
      uVar30 = (uint)uVar9;
      uVar7 = uVar30 + 3;
      if (-1 < (int)uVar30) {
        uVar7 = uVar30;
      }
      puVar17 = (undefined1 *)
                ((long)(int)(((int)uVar7 >> 2) + (uVar30 - (uVar7 & 0xfffffffc))) * local_160 +
                (long)local_1b0);
      puVar34 = (undefined1 *)((long)(int)(iVar6 * (int)(float)local_1a0 * uVar30) + (long)local_d8)
      ;
      if ((int)uVar13 < 2) {
        uVar30 = 0;
      }
      else {
        iVar26 = 1;
        do {
          *puVar17 = *puVar34;
          puVar17[1] = puVar34[1];
          puVar17 = puVar17 + 2;
          puVar34 = puVar34 + 2;
          iVar26 = iVar26 + 2;
          uVar30 = uVar13 & 0xfffffffe;
        } while (iVar26 < (int)uVar13);
      }
      if ((int)uVar30 < (int)uVar13) {
        lVar33 = 0;
        do {
          puVar17[lVar33] = puVar34[lVar33];
          lVar33 = lVar33 + 1;
        } while (uVar13 - uVar30 != (int)lVar33);
      }
      uVar9 = uVar9 + 1;
    } while ((long)uVar9 < (long)local_168);
  }
  local_48 = (undefined1 *)(ulong)(uint)fVar5;
  local_128._0_4_ = fVar16;
  if (0 < (int)fVar16) {
    local_12c = uVar13 & 0xfffffffe;
    uVar9 = 0;
    do {
      uVar43 = 0;
      fVar16 = 0.0;
      if (local_b0 != (void *)0x0) {
        fVar16 = *(float *)((long)local_b0 + uVar9 * 0x10);
      }
      lVar33 = uVar9 * 4 + 1;
      if (local_b0 != (void *)0x0) {
        uVar43 = *(undefined4 *)((long)local_b0 + lVar33 * 4);
      }
      lVar32 = uVar9 * 4 + 2;
      uVar47 = 0;
      uVar48 = 0;
      if (local_b0 != (void *)0x0) {
        uVar48 = *(undefined4 *)((long)local_b0 + lVar32 * 4);
      }
      lVar36 = uVar9 * 4 + 3;
      if (local_b0 != (void *)0x0) {
        uVar47 = *(undefined4 *)((long)local_b0 + lVar36 * 4);
      }
      local_198 = CONCAT44(local_198._4_4_,uVar43);
      sVar2 = local_60->cstep;
      pvVar35 = local_60->data;
      sVar3 = local_60->elemsize;
      puVar17 = (undefined1 *)(uVar9 * 4 * sVar2 * sVar3 + (long)pvVar35);
      puVar41 = (undefined1 *)(sVar2 * lVar33 * sVar3 + (long)pvVar35);
      puVar34 = (undefined1 *)(sVar2 * lVar32 * sVar3 + (long)pvVar35);
      pcVar38 = (char *)(sVar2 * lVar36 * sVar3 + (long)pvVar35);
      pfVar4 = (scale_requant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_118._0_4_ = pfVar4[uVar9 * 8];
      local_128._0_4_ = pfVar4[uVar9 * 8 + 1];
      local_1b4 = pfVar4[lVar36 * 2 + 1];
      local_178 = CONCAT44(local_178._4_4_,fVar16);
      local_148 = (void *)CONCAT44(local_148._4_4_,uVar47);
      local_108._0_4_ = uVar48;
      local_d8 = (void *)CONCAT44(local_d8._4_4_,pfVar4[lVar33 * 2]);
      local_158 = CONCAT44(local_158._4_4_,pfVar4[lVar33 * 2 + 1]);
      local_e8 = CONCAT44(local_e8._4_4_,pfVar4[lVar32 * 2]);
      local_1a0 = CONCAT44(local_1a0._4_4_,pfVar4[lVar32 * 2 + 1]);
      local_180 = CONCAT44(local_180._4_4_,pfVar4[lVar36 * 2]);
      local_a8 = uVar9;
      if ((int)fVar5 < 4) {
        puVar11 = (undefined1 *)0x0;
      }
      else {
        local_f0 = (char *)(local_160 * uVar9 + (long)local_1b0);
        puVar11 = (undefined1 *)0x0;
        do {
          pvVar35 = (void *)(((ulong)puVar11 >> 2) * local_1a8 + (long)pvVar42);
          local_1d8 = (void *)0x0;
          uStack_1d0 = 0;
          local_98[8] = 0;
          local_98[9] = 0;
          local_98[10] = 0;
          local_98[0xb] = 0;
          local_98[4] = 0;
          local_98[5] = 0;
          local_98[6] = 0;
          local_98[7] = 0;
          local_98[0] = 0;
          local_98[1] = 0;
          local_98[2] = 0;
          local_98[3] = 0;
          pcVar18 = local_f0;
          uVar30 = 0;
          if (1 < (int)uVar13) {
            iVar6 = 0;
            do {
              lVar33 = 0;
              do {
                iVar26 = (int)*(char *)((long)pvVar35 + lVar33) * (int)*pcVar18 +
                         *(int *)((long)&local_1d8 + lVar33 * 2);
                *(int *)((long)&local_1d8 + lVar33 * 2) = iVar26;
                *(int *)((long)&local_1d8 + lVar33 * 2) =
                     (int)*(char *)((long)pvVar35 + lVar33 + 1) * (int)pcVar18[1] + iVar26;
                iVar26 = (int)*(char *)((long)pvVar35 + lVar33) * (int)pcVar18[2] +
                         *(int *)((long)local_98 + lVar33 * 2 + 0x20);
                *(int *)((long)local_98 + lVar33 * 2 + 0x20) = iVar26;
                *(int *)((long)local_98 + lVar33 * 2 + 0x20) =
                     (int)*(char *)((long)pvVar35 + lVar33 + 1) * (int)pcVar18[3] + iVar26;
                iVar26 = (int)*(char *)((long)pvVar35 + lVar33) * (int)pcVar18[4] +
                         *(int *)((long)local_98 + lVar33 * 2 + 0x10);
                *(int *)((long)local_98 + lVar33 * 2 + 0x10) = iVar26;
                *(int *)((long)local_98 + lVar33 * 2 + 0x10) =
                     (int)*(char *)((long)pvVar35 + lVar33 + 1) * (int)pcVar18[5] + iVar26;
                iVar26 = (int)*(char *)((long)pvVar35 + lVar33) * (int)pcVar18[6] +
                         *(int *)((long)local_98 + lVar33 * 2);
                *(int *)((long)local_98 + lVar33 * 2) = iVar26;
                *(int *)((long)local_98 + lVar33 * 2) =
                     (int)*(char *)((long)pvVar35 + lVar33 + 1) * (int)pcVar18[7] + iVar26;
                lVar33 = lVar33 + 2;
              } while (lVar33 != 8);
              pcVar18 = pcVar18 + 8;
              pvVar35 = (void *)((long)pvVar35 + 8);
              iVar26 = iVar6 + 3;
              iVar6 = iVar6 + 2;
              uVar30 = local_12c;
            } while (iVar26 < (int)uVar13);
          }
          if ((int)uVar30 < (int)uVar13) {
            do {
              lVar33 = 0;
              do {
                piVar1 = (int *)((long)&local_1d8 + lVar33 * 4);
                *piVar1 = *piVar1 + (int)*(char *)((long)pvVar35 + lVar33) * (int)*pcVar18;
                local_98[lVar33 + 8] =
                     local_98[lVar33 + 8] + (int)*(char *)((long)pvVar35 + lVar33) * (int)pcVar18[1]
                ;
                local_98[lVar33 + 4] =
                     local_98[lVar33 + 4] + (int)*(char *)((long)pvVar35 + lVar33) * (int)pcVar18[2]
                ;
                local_98[lVar33] =
                     local_98[lVar33] + (int)*(char *)((long)pvVar35 + lVar33) * (int)pcVar18[3];
                lVar33 = lVar33 + 1;
              } while (lVar33 != 4);
              pcVar18 = pcVar18 + 4;
              pvVar35 = (void *)((long)pvVar35 + 4);
              uVar30 = uVar30 + 1;
            } while (uVar30 != uVar13);
          }
          lVar33 = 0;
          local_a0 = puVar11;
          do {
            fVar16 = roundf(((float)*(int *)((long)&local_1d8 + lVar33 * 4) * (float)local_118._0_4_
                            + fVar16) * (float)local_128._0_4_);
            if (fVar16 <= -128.0) {
              fVar16 = -128.0;
            }
            if (127.0 <= fVar16) {
              fVar16 = 127.0;
            }
            puVar17[lVar33] = (char)(int)fVar16;
            fVar16 = roundf(((float)local_98[lVar33 + 8] * (float)local_d8 + (float)local_198) *
                            (float)local_158);
            if (fVar16 <= -128.0) {
              fVar16 = -128.0;
            }
            if (127.0 <= fVar16) {
              fVar16 = 127.0;
            }
            puVar41[lVar33] = (char)(int)fVar16;
            fVar16 = roundf(((float)local_98[lVar33 + 4] * (float)local_e8 + (float)local_108._0_4_)
                            * (float)local_1a0);
            if (fVar16 <= -128.0) {
              fVar16 = -128.0;
            }
            if (127.0 <= fVar16) {
              fVar16 = 127.0;
            }
            puVar34[lVar33] = (char)(int)fVar16;
            fVar16 = roundf(((float)local_98[lVar33] * (float)local_180 + (float)local_148) *
                            local_1b4);
            if (fVar16 <= -128.0) {
              fVar16 = -128.0;
            }
            if (127.0 <= fVar16) {
              fVar16 = 127.0;
            }
            pcVar38[lVar33] = (char)(int)fVar16;
            lVar33 = lVar33 + 1;
            fVar16 = (float)local_178;
          } while (lVar33 != 4);
          puVar17 = puVar17 + 4;
          puVar41 = puVar41 + 4;
          puVar34 = puVar34 + 4;
          pcVar38 = pcVar38 + 4;
          puVar11 = local_a0 + 4;
        } while (local_a0 + 7 < local_48);
      }
      if ((int)puVar11 < (int)fVar5) {
        local_50 = (char *)(local_160 * local_a8 + (long)local_1b0);
        do {
          pcVar12 = (char *)((((uint)puVar11 & 3) + ((uint)((ulong)puVar11 >> 2) & 0x3fffffff)) *
                             local_1a8 + (long)pvVar42);
          iVar6 = 0;
          pcVar18 = local_50;
          if ((int)uVar13 < 2) {
            iVar26 = 0;
            iVar14 = 0;
            iVar24 = 0;
            uVar30 = 0;
          }
          else {
            iVar24 = 0;
            iVar27 = 1;
            iVar14 = 0;
            iVar26 = 0;
            iVar6 = 0;
            do {
              iVar28 = (int)*pcVar12;
              iVar31 = (int)pcVar12[1];
              iVar6 = pcVar18[1] * iVar31 + *pcVar18 * iVar28 + iVar6;
              iVar26 = pcVar18[3] * iVar31 + pcVar18[2] * iVar28 + iVar26;
              iVar14 = pcVar18[5] * iVar31 + pcVar18[4] * iVar28 + iVar14;
              iVar24 = pcVar18[7] * iVar31 + pcVar18[6] * iVar28 + iVar24;
              pcVar18 = pcVar18 + 8;
              pcVar12 = pcVar12 + 2;
              iVar27 = iVar27 + 2;
              uVar30 = local_12c;
            } while (iVar27 < (int)uVar13);
          }
          if ((int)uVar30 < (int)uVar13) {
            lVar33 = 0;
            do {
              iVar27 = (int)pcVar12[lVar33];
              iVar6 = iVar6 + pcVar18[lVar33 * 4] * iVar27;
              iVar26 = iVar26 + pcVar18[lVar33 * 4 + 1] * iVar27;
              iVar14 = iVar14 + pcVar18[lVar33 * 4 + 2] * iVar27;
              iVar24 = iVar24 + pcVar18[lVar33 * 4 + 3] * iVar27;
              lVar33 = lVar33 + 1;
            } while (uVar13 - uVar30 != (int)lVar33);
          }
          local_f0 = pcVar38;
          local_a0 = puVar17;
          local_38 = puVar11;
          fVar16 = roundf(((float)iVar6 * (float)local_118._0_4_ + fVar16) * (float)local_128._0_4_)
          ;
          puVar17 = local_a0;
          if (fVar16 <= -128.0) {
            fVar16 = -128.0;
          }
          if (127.0 <= fVar16) {
            fVar16 = 127.0;
          }
          *local_a0 = (char)(int)fVar16;
          fVar16 = roundf(((float)iVar26 * (float)local_d8 + (float)local_198) * (float)local_158);
          if (fVar16 <= -128.0) {
            fVar16 = -128.0;
          }
          if (127.0 <= fVar16) {
            fVar16 = 127.0;
          }
          *puVar41 = (char)(int)fVar16;
          fVar16 = roundf(((float)iVar14 * (float)local_e8 + (float)local_108._0_4_) *
                          (float)local_1a0);
          if (fVar16 <= -128.0) {
            fVar16 = -128.0;
          }
          if (127.0 <= fVar16) {
            fVar16 = 127.0;
          }
          *puVar34 = (char)(int)fVar16;
          fVar16 = roundf(((float)iVar24 * (float)local_180 + (float)local_148) * local_1b4);
          if (fVar16 <= -128.0) {
            fVar16 = -128.0;
          }
          if (127.0 <= fVar16) {
            fVar16 = 127.0;
          }
          *local_f0 = (char)(int)fVar16;
          puVar17 = puVar17 + 1;
          puVar41 = puVar41 + 1;
          puVar34 = puVar34 + 1;
          pcVar38 = local_f0 + 1;
          fVar8 = (float)((int)local_38 + 1);
          puVar11 = (undefined1 *)(ulong)(uint)fVar8;
          fVar16 = (float)local_178;
        } while (fVar8 != fVar5);
      }
      uVar9 = local_a8 + 1;
    } while (uVar9 != local_58);
  }
  if ((int)local_b8 != (int)local_168) {
    local_1a0 = CONCAT44(local_1a0._4_4_,uVar13) & 0xfffffffffffffffe;
    lVar33 = (long)(int)local_b8;
    pvVar35 = local_b0;
    do {
      if (pvVar35 == (void *)0x0) {
        auVar44 = ZEXT812(0);
      }
      else {
        auVar44._4_8_ = 0;
        auVar44._0_4_ = *(uint *)((long)pvVar35 + lVar33 * 4);
      }
      auVar46._12_4_ = 0;
      auVar46._0_12_ = auVar44;
      puVar23 = (undefined4 *)(local_60->cstep * lVar33 * local_60->elemsize + (long)local_60->data)
      ;
      uVar9 = 0;
      pfVar4 = (scale_requant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      fVar16 = pfVar4[lVar33 * 2];
      local_118 = ZEXT416((uint)fVar16);
      local_128._0_4_ = pfVar4[lVar33 * 2 + 1];
      local_128._4_12_ = (undefined1  [12])0x0;
      local_180 = lVar33;
      local_108 = auVar46;
      if (3 < (int)fVar5) {
        uVar30 = (uint)lVar33;
        uVar7 = uVar30 + 3;
        if (-1 < (int)uVar30) {
          uVar7 = uVar30;
        }
        pcVar38 = (char *)((long)(int)(((int)uVar7 >> 2) + (uVar30 - (uVar7 & 0xfffffffc))) *
                           local_160 + (long)local_1b0);
        local_d8 = (void *)CONCAT44(fVar16,fVar16);
        local_108._0_4_ = auVar44._0_4_;
        local_158 = CONCAT44(local_108._0_4_,local_108._0_4_);
        fStack_150 = (float)local_108._0_4_;
        fStack_14c = (float)local_108._0_4_;
        local_e8 = CONCAT44(local_128._0_4_,local_128._0_4_);
        uVar39 = 0;
        fStack_e0 = (float)local_128._0_4_;
        fStack_dc = (float)local_128._0_4_;
        fStack_d0 = fVar16;
        fStack_cc = fVar16;
        do {
          pvVar35 = (void *)((uVar39 >> 2) * local_1a8 + (long)pvVar42);
          uVar30 = 0;
          local_1d8 = (void *)0x0;
          uStack_1d0 = 0;
          pcVar18 = pcVar38;
          if (1 < (int)uVar13) {
            iVar6 = 0;
            do {
              lVar33 = 0;
              do {
                iVar26 = (int)*(char *)((long)pvVar35 + lVar33 * 2) * (int)*pcVar18 +
                         *(int *)((long)&local_1d8 + lVar33 * 4);
                *(int *)((long)&local_1d8 + lVar33 * 4) = iVar26;
                *(int *)((long)&local_1d8 + lVar33 * 4) =
                     (int)*(char *)((long)pvVar35 + lVar33 * 2 + 1) * (int)pcVar18[1] + iVar26;
                lVar33 = lVar33 + 1;
              } while (lVar33 != 4);
              pcVar18 = pcVar18 + 2;
              pvVar35 = (void *)((long)pvVar35 + 8);
              iVar26 = iVar6 + 3;
              iVar6 = iVar6 + 2;
            } while (iVar26 < (int)uVar13);
            uVar30 = (uint)(float)local_1a0;
          }
          if ((int)uVar30 < (int)uVar13) {
            do {
              lVar33 = 0;
              do {
                piVar1 = (int *)((long)&local_1d8 + lVar33 * 4);
                *piVar1 = *piVar1 + (int)*(char *)((long)pvVar35 + lVar33) * (int)*pcVar18;
                lVar33 = lVar33 + 1;
              } while (lVar33 != 4);
              pcVar18 = pcVar18 + 1;
              pvVar35 = (void *)((long)pvVar35 + 4);
              uVar30 = uVar30 + 1;
            } while (uVar30 != uVar13);
          }
          fStack_190 = ((float)(int)uStack_1d0 * fStack_d0 + fStack_150) * fStack_e0;
          fStack_18c = ((float)uStack_1d0._4_4_ * fStack_cc + fStack_14c) * fStack_dc;
          local_198 = CONCAT44(((float)local_1d8._4_4_ * local_d8._4_4_ + local_158._4_4_) *
                               local_e8._4_4_,
                               ((float)(int)local_1d8 * (float)local_d8 + (float)local_158) *
                               (float)local_e8);
          local_178._0_4_ = roundf(fStack_18c);
          local_178._4_4_ = extraout_XMM0_Db;
          fVar16 = roundf(fStack_190);
          uStack_16c = local_178._4_4_;
          local_178 = CONCAT44((float)local_178,fVar16);
          fVar16 = roundf((float)local_198);
          local_148 = (void *)CONCAT44(extraout_XMM0_Db_00,fVar16);
          fVar16 = roundf(local_198._4_4_);
          auVar45._0_4_ = (int)(float)local_148;
          auVar45._4_4_ = (int)fVar16;
          auVar45._8_4_ = (int)(float)local_178;
          auVar45._12_4_ = (int)(float)(local_178 >> 0x20);
          auVar46 = packssdw(auVar45,auVar45);
          auVar46 = packsswb(auVar46,auVar46);
          *puVar23 = auVar46._0_4_;
          puVar23 = puVar23 + 1;
          uVar9 = uVar39 + 4;
          puVar17 = (undefined1 *)(uVar39 + 7);
          pvVar35 = local_b0;
          uVar39 = uVar9;
        } while (puVar17 < local_48);
      }
      pvVar22 = local_1b0;
      if ((int)uVar9 < (int)fVar5) {
        uVar30 = (uint)local_180;
        uVar7 = uVar30 + 3;
        if (-1 < (int)uVar30) {
          uVar7 = uVar30;
        }
        lVar33 = (long)(int)(((int)uVar7 >> 2) + (uVar30 - (uVar7 & 0xfffffffc))) * local_160;
        do {
          if ((int)uVar13 < 1) {
            fVar16 = 0.0;
          }
          else {
            lVar32 = 0;
            iVar6 = 0;
            do {
              iVar6 = iVar6 + (int)*(char *)((long)pvVar42 +
                                            lVar32 + (((uint)uVar9 & 3) +
                                                     ((uint)(uVar9 >> 2) & 0x3fffffff)) * local_1a8)
                              * (int)*(char *)((long)pvVar22 + lVar32 + lVar33);
              lVar32 = lVar32 + 1;
            } while (uVar13 != (uint)lVar32);
            fVar16 = (float)iVar6;
          }
          fVar16 = roundf((fVar16 * (float)local_118._0_4_ + (float)local_108._0_4_) *
                          (float)local_128._0_4_);
          if (fVar16 <= -128.0) {
            fVar16 = -128.0;
          }
          if (127.0 <= fVar16) {
            fVar16 = 127.0;
          }
          *(char *)puVar23 = (char)(int)fVar16;
          puVar23 = (undefined4 *)((long)puVar23 + 1);
          fVar16 = (float)((uint)uVar9 + 1);
          uVar9 = (ulong)(uint)fVar16;
        } while (fVar16 != fVar5);
      }
      lVar33 = local_180 + 1;
    } while (lVar33 < (long)local_168);
  }
  piVar1 = local_f8;
  if (local_68 != (int *)0x0) {
    LOCK();
    *local_68 = *local_68 + -1;
    UNLOCK();
    if (*local_68 == 0) {
      if (local_40 == (Allocator *)0x0) {
        if (local_1b0 != (void *)0x0) {
          free(local_1b0);
        }
      }
      else {
        (*local_40->_vptr_Allocator[3])(local_40,local_1b0);
      }
    }
  }
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_c8 == (Allocator *)0x0) {
        if (pvVar42 != (void *)0x0) {
          free(pvVar42);
        }
      }
      else {
        (*local_c8->_vptr_Allocator[3])(local_c8,pvVar42);
      }
    }
  }
  if (local_1c0 != (int *)0x0) {
    LOCK();
    *local_1c0 = *local_1c0 + -1;
    UNLOCK();
    if (*local_1c0 == 0) {
      if (local_c0 == (Allocator *)0x0) {
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
      }
      else {
        (*local_c0->_vptr_Allocator[3])(local_c0,__ptr);
      }
    }
  }
  return;
}

Assistant:

static void conv_im2col_sgemm_int8_requant_sse(const Mat &bottom_blob, Mat &top_blob, const Mat &_kernel, \
            const int kernel_w, const int kernel_h, const int stride_w, const int stride_h, const Mat &_bias, std::vector<float> scale_requant, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const signed char *kernel = _kernel;
    const float* bias = _bias;

    // im2row
    Mat bottom_im2row(kernel_h*kernel_w*inch, outw*outh, 1UL, opt.workspace_allocator);
    {
        signed char* ret = (signed char*)bottom_im2row;
        int retID = 0;
    
        for (int i=0; i<outh; i++)
        {
            for (int j=0; j<outw; j++)
            {
                for (int p=0; p<inch; p++)
                {
                    const signed char* input = bottom_blob.channel(p);
                    for (int u=0; u<kernel_h; u++)
                    {
                        for (int v=0; v<kernel_w; v++)
                        {    
                            int row = u + i * stride_h;
                            int col = v + j * stride_w;
                            int index = row * w + col;
                            ret[retID] = input[index];
                            retID++;
                        }
                    }                
                }
            }
        }
    }    

    int kernel_size = kernel_w * kernel_h;
    int out_size = outw * outh;

    // int M = outch;  // outch
    int N = outw * outh; // outsize or out stride
    int K = kernel_w * kernel_h * inch; // ksize * inch

    // bottom_im2row memory packed 4 x 4
    Mat bottom_tm(4*kernel_size, inch, out_size/4 + out_size%4, (size_t)1u, opt.workspace_allocator);
    {
        int nn_size = out_size >> 2;
        int remain_size_start = nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii=0; ii<nn_size; ii++)
        {
            int i = ii * 4;

            const signed char* img0 = bottom_im2row.row<signed char>(i);
            const signed char* img1 = bottom_im2row.row<signed char>(i+1);
            const signed char* img2 = bottom_im2row.row<signed char>(i+2);
            const signed char* img3 = bottom_im2row.row<signed char>(i+3);

            signed char* tmpptr = bottom_tm.channel(i/4);

            int q = 0;
            for (; q+1<inch*kernel_size; q=q+2)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];
                tmpptr[2] = img1[0];
                tmpptr[3] = img1[1];
                tmpptr[4] = img2[0];
                tmpptr[5] = img2[1];
                tmpptr[6] = img3[0];
                tmpptr[7] = img3[1];

                tmpptr += 8;
                img0 += 2;
                img1 += 2;
                img2 += 2;
                img3 += 2;
            }

            for (; q<inch*kernel_size; q++)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img1[0];
                tmpptr[2] = img2[0];
                tmpptr[3] = img3[0];

                tmpptr += 4;
                img0 += 1;
                img1 += 1;
                img2 += 1;
                img3 += 1;                
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=remain_size_start; i<out_size; i++)
        {
            const signed char* img0 = bottom_im2row.row<signed char>(i);

            signed char* tmpptr = bottom_tm.channel(i/4 + i%4);

            int q=0;
            for (; q+1<inch*kernel_size; q=q+2)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];

                tmpptr += 2;
                img0 += 2;
            }

            for (; q<inch*kernel_size; q++)
            {
                tmpptr[0] = img0[0];

                tmpptr += 1;
                img0 += 1;
            }
        }       
    }

    // kernel memory packed 4 x 4
    Mat kernel_tm(4*kernel_size, inch, outch/4 + outch%4, (size_t)1u, opt.workspace_allocator);
    {
        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;
        
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp=0; pp<nn_outch; pp++)
        {
            int p = pp * 4;

            const signed char* k0 = kernel + (p+0)*inch*kernel_size;
            const signed char* k1 = kernel + (p+1)*inch*kernel_size;
            const signed char* k2 = kernel + (p+2)*inch*kernel_size;
            const signed char* k3 = kernel + (p+3)*inch*kernel_size;

            signed char* ktmp = kernel_tm.channel(p/4);

            int q=0;
            for (; q+1<inch*kernel_size; q+=2)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k0[1];
                ktmp[2] = k1[0];
                ktmp[3] = k1[1];
                ktmp[4] = k2[0];
                ktmp[5] = k2[1];
                ktmp[6] = k3[0];
                ktmp[7] = k3[1];

                ktmp += 8;

                k0 += 2;
                k1 += 2;
                k2 += 2;
                k3 += 2;
            }

            for (; q<inch*kernel_size; q++)
            { 
                ktmp[0] = k0[0];
                ktmp[1] = k1[0];
                ktmp[2] = k2[0];
                ktmp[3] = k3[0];
                ktmp += 4;

                k0 += 1;
                k1 += 1;
                k2 += 1;
                k3 += 1;
            }           
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=remain_outch_start; p<outch; p++)
        {
            const signed char* k0 = kernel + (p+0)*inch*kernel_size;

            signed char* ktmp = kernel_tm.channel(p/4 + p%4);

            int q=0;
            for (; q+1<inch*kernel_size; q=q+2)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k0[1];
                ktmp += 2;
                k0 += 2;
            }

            for (; q<inch*kernel_size; q++)
            {
                ktmp[0] = k0[0];
                ktmp++;
                k0++;
            }
        }
    }    

    // 4x4
    // sgemm(int M, int N, int K, float* A, float* B, float* C)
    {
        // int M = outch;  // outch
        // int N = outw * outh; // outsize or out stride
        // int L = kernel_w * kernel_h * inch; // ksize * inch

        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;
        
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp=0; pp<nn_outch; pp++)
        {
            int i = pp * 4;

            signed char* output0 = top_blob.channel(i);
            signed char* output1 = top_blob.channel(i+1);
            signed char* output2 = top_blob.channel(i+2);
            signed char* output3 = top_blob.channel(i+3);

            const float bias0 = bias ? bias[i] : 0.f;
            const float bias1 = bias ? bias[i+1] : 0.f;
            const float bias2 = bias ? bias[i+2] : 0.f;
            const float bias3 = bias ? bias[i+3] : 0.f;

            const float scale_requant_in0  = scale_requant[2*i];
            const float scale_requant_out0 = scale_requant[2*i+1];
            const float scale_requant_in1  = scale_requant[2*(i+1)];
            const float scale_requant_out1 = scale_requant[2*(i+1)+1];
            const float scale_requant_in2  = scale_requant[2*(i+2)];
            const float scale_requant_out2 = scale_requant[2*(i+2)+1];
            const float scale_requant_in3  = scale_requant[2*(i+3)];
            const float scale_requant_out3 = scale_requant[2*(i+3)+1];

            int j=0;
            for (; j+3<N; j=j+4)
            {
                signed char* vb = bottom_tm.channel(j/4);
                signed char* va = kernel_tm.channel(i/4);
                
                int sum0[4] = {0};
                int sum1[4] = {0};
                int sum2[4] = {0};
                int sum3[4] = {0};
               
                int k=0;

                for (; k+1<K; k=k+2)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum0[n] += (int)va[0] * vb[2*n];   // k0
                        sum0[n] += (int)va[1] * vb[2*n+1];

                        sum1[n] += (int)va[2] * vb[2*n];   // k1
                        sum1[n] += (int)va[3] * vb[2*n+1];

                        sum2[n] += (int)va[4] * vb[2*n];   // k2
                        sum2[n] += (int)va[5] * vb[2*n+1];

                        sum3[n] += (int)va[6] * vb[2*n];   // k3
                        sum3[n] += (int)va[7] * vb[2*n+1];
                    }

                    va += 8;
                    vb += 8;
                }

                for (; k<K; k++)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum0[n] += (int)va[0] * vb[n];
                        sum1[n] += (int)va[1] * vb[n];
                        sum2[n] += (int)va[2] * vb[n];
                        sum3[n] += (int)va[3] * vb[n];
                    }
                    
                    va += 4;
                    vb += 4;
                }

                for (int n=0; n<4; n++)
                {
                    output0[n] = float2int8(((float)sum0[n] * scale_requant_in0 + bias0) * scale_requant_out0);
                    output1[n] = float2int8(((float)sum1[n] * scale_requant_in1 + bias1) * scale_requant_out1);
                    output2[n] = float2int8(((float)sum2[n] * scale_requant_in2 + bias2) * scale_requant_out2);
                    output3[n] = float2int8(((float)sum3[n] * scale_requant_in3 + bias3) * scale_requant_out3);
                }
                output0 += 4;
                output1 += 4;
                output2 += 4;
                output3 += 4;
            }

            for (; j<N; j++)
            {                
                int sum0 = 0;
                int sum1 = 0;
                int sum2 = 0;
                int sum3 = 0;

                signed char* vb = bottom_tm.channel(j/4 + j%4);
                signed char* va = kernel_tm.channel(i/4);

                int k=0;

                for (; k+1<K; k=k+2)
                {
                    sum0 += (int)va[0] * vb[0];
                    sum0 += (int)va[1] * vb[1];

                    sum1 += (int)va[2] * vb[0];
                    sum1 += (int)va[3] * vb[1];

                    sum2 += (int)va[4] * vb[0];
                    sum2 += (int)va[5] * vb[1];

                    sum3 += (int)va[6] * vb[0];
                    sum3 += (int)va[7] * vb[1];

                    va += 8;
                    vb += 2;
                }

                for (; k<K; k++)
                {
                    sum0 += (int)va[0] * vb[0];
                    sum1 += (int)va[1] * vb[0];
                    sum2 += (int)va[2] * vb[0];
                    sum3 += (int)va[3] * vb[0];

                    va += 4;
                    vb += 1;
                }
                
                output0[0] = float2int8(((float)sum0 * scale_requant_in0 + bias0) * scale_requant_out0);
                output1[0] = float2int8(((float)sum1 * scale_requant_in1 + bias1) * scale_requant_out1);
                output2[0] = float2int8(((float)sum2 * scale_requant_in2 + bias2) * scale_requant_out2);
                output3[0] = float2int8(((float)sum3 * scale_requant_in3 + bias3) * scale_requant_out3);

                output0++;
                output1++;
                output2++;
                output3++;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=remain_outch_start; i<outch; i++)
        {
            signed char* output = top_blob.channel(i);

            const float bias0 = bias ? bias[i] : 0.f;

            const float scale_requant_in0  = scale_requant[2*i];
            const float scale_requant_out0 = scale_requant[2*i+1];            

            int j=0;
            for (; j+3<N; j=j+4)
            {
                signed char* vb = bottom_tm.channel(j/4);
                signed char* va = kernel_tm.channel(i/4 + i%4);
                int sum[4] = {0};

                int k=0;
                for (; k+1<K; k=k+2)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum[n] += (int)va[0] * vb[2*n];
                        sum[n] += (int)va[1] * vb[2*n+1];
                    }
                    va += 2;
                    vb += 8;
                }

                for (; k<K; k++)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum[n] += (int)va[0] * vb[n];
                    }
                    va += 1;
                    vb += 4;
                }

                for (int n=0; n<4; n++)
                {
                    output[n] = float2int8(((float)sum[n] * scale_requant_in0 + bias0) * scale_requant_out0);
                }
                output += 4;
            }

            for (; j<N; j++)
            {
                int sum = 0;

                signed char* vb = bottom_tm.channel(j/4 + j%4);
                signed char* va = kernel_tm.channel(i/4 + i%4);

                for (int k=0; k<K; k++)
                {
                    sum += (int)va[0] * vb[0];

                    va += 1;
                    vb += 1;
                }
                output[0] = float2int8(((float)sum * scale_requant_in0 + bias0) * scale_requant_out0);

                output++;
            }
        }
    }

    // // sgemm(int M, int N, int K, float* A, float* B, float* C)
    // {
    //     for (int i=0; i<M; i++)
    //     {
    //         int* output = top_blob.channel(i);

    //         for (int j=0; j<N; j++)
    //         {
    //             int sum = 0;

    //             signed char* vb = (signed char*)bottom_im2row + K * j;
    //             const signed char* va = kernel + K * i;

    //             for (int k=0; k<K; k++)
    //             {
    //                 sum += (int)va[0] * vb[0];

    //                 va += 1;
    //                 vb += 1;
    //             }
    //             output[0] = sum;

    //             output++;
    //         }
    //     }
    // }
}